

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mixed_arena.h
# Opt level: O2

Expression * __thiscall
ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::removeAt
          (ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*> *this,size_t index)

{
  Expression *pEVar1;
  ulong size;
  
  if (index < this->usedElements) {
    pEVar1 = this->data[index];
    size = this->usedElements - 1;
    for (; index < size; index = index + 1) {
      this->data[index] = this->data[index + 1];
    }
    resize(this,size);
    return pEVar1;
  }
  __assert_fail("index < size()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/mixed_arena.h"
                ,0x17d,
                "T ArenaVectorBase<ArenaVector<wasm::Expression *>, wasm::Expression *>::removeAt(size_t) [SubType = ArenaVector<wasm::Expression *>, T = wasm::Expression *]"
               );
}

Assistant:

T removeAt(size_t index) {
    assert(index < size());
    auto item = data[index];
    for (auto i = index; i < size() - 1; ++i) {
      data[i] = data[i + 1];
    }
    resize(size() - 1);
    return item;
  }